

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  char *pcVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  pointer piVar4;
  char cVar5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar10;
  ostream *poVar11;
  mapped_type *this_00;
  int iVar12;
  pointer pRVar13;
  _Base_ptr fileName_00;
  char *pcVar14;
  cmCTestCoverageHandler *this_01;
  iterator __position;
  pointer pbVar15;
  string nl;
  string prefix;
  string tempDir;
  string daGlob;
  string testingDir;
  string actualSourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string fileName;
  ostringstream cmCTestLog_msg_4;
  ostringstream cmCTestLog_msg;
  Glob gl;
  undefined1 local_550 [56];
  _Base_ptr local_518 [2];
  _Base_ptr local_508;
  size_t local_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [40];
  undefined1 local_490 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  string local_448;
  cmCTestCoverageHandlerContainer *local_428;
  _Base_ptr local_420;
  _Base_ptr local_418;
  char *local_410;
  undefined1 local_408 [16];
  _Base_ptr local_3f8 [12];
  ios_base local_398 [264];
  undefined1 local_290 [32];
  byte abStack_270 [80];
  ios_base local_220 [408];
  Glob local_88;
  
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = true;
  local_88.RecurseThroughSymlinks = false;
  local_4c8._0_8_ = local_4c8 + 0x10;
  pcVar2 = (cont->BinaryDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4d8 + 0x10),pcVar2,pcVar2 + (cont->BinaryDir)._M_string_length);
  std::__cxx11::string::append(local_4d8 + 0x10);
  cmsys::Glob::FindFiles(&local_88,(string *)(local_4d8 + 0x10),(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_460,__x);
  if (local_460.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_460.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290," Cannot find any Python Trace.py coverage files.",0x30);
    std::ios::widen((char)(ostream *)local_290 + (char)*(undefined8 *)(local_290._0_8_ + -0x18));
    std::ostream::put((char)local_290);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x680,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),
                 (this->super_cmCTestGenericHandler).Quiet);
    if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
      operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                      (ulong)((long)&local_3f8[0]->_M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
    std::ios_base::~ios_base(local_220);
    iVar9 = 0;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_((string *)local_290,(this->super_cmCTestGenericHandler).CTest);
    plVar10 = (long *)std::__cxx11::string::append(local_290);
    local_4b8._24_8_ = (long)local_4b8 + 0x28;
    pRVar13 = (pointer)(plVar10 + 2);
    if ((pointer)*plVar10 == pRVar13) {
      local_490._0_8_ = (pRVar13->regmatch).startp[0];
      local_490._8_8_ = plVar10[3];
    }
    else {
      local_490._0_8_ = (pRVar13->regmatch).startp[0];
      local_4b8._24_8_ = (pointer)*plVar10;
    }
    local_4b8._32_8_ = plVar10[1];
    *plVar10 = (long)pRVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    local_4e8._0_8_ = local_4e8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4f8 + 0x10),local_4b8._24_8_,
               local_4b8._32_8_ + (long)((RegularExpressionMatch *)local_4b8._24_8_)->startp);
    std::__cxx11::string::append(local_4f8 + 0x10);
    pbVar15 = (pointer)0x0;
    this_01 = (cmCTestCoverageHandler *)0x0;
    cmsys::SystemTools::MakeDirectory((string *)(local_4f8 + 0x10),(mode_t *)0x0);
    local_418 = (_Base_ptr)
                local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_460.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_460.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_420 = (_Base_ptr)&cont->TotalCoverage;
      pbVar15 = (pointer)0x0;
      fileName_00 = (_Base_ptr)
                    local_460.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_550._32_8_ = this;
      local_428 = cont;
      do {
        FindFile(&local_448,this_01,cont,(string *)fileName_00);
        if ((char *)local_448._M_string_length == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"Cannot find source Python file corresponding to: ",0x31);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,*(char **)fileName_00,
                               (long)fileName_00->_M_parent);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x68f,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),false);
          if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
            operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                            (ulong)((long)&local_3f8[0]->_M_color + 1));
          }
          this_01 = (cmCTestCoverageHandler *)&std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
        }
        else {
          cmsys::SystemTools::CollapseFullPath((string *)((long)local_490 + 0x10),&local_448);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"   Check coverage for file: ",0x1c);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,(char *)local_490._16_8_,local_490._24_8_);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x697,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),
                       (this->super_cmCTestGenericHandler).Quiet);
          local_4b8._16_8_ = pbVar15;
          if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
            operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                            (ulong)((long)&local_3f8[0]->_M_color + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)local_420,(key_type *)((long)local_490 + 0x10));
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_290,"   in file: ",0xc);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_290,*(char **)fileName_00,
                               (long)fileName_00->_M_parent);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x69b,(char *)CONCAT44(local_408._4_4_,local_408._0_4_),
                       (this->super_cmCTestGenericHandler).Quiet);
          if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
            operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                            (ulong)((long)&local_3f8[0]->_M_color + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
          std::ios_base::~ios_base(local_220);
          std::ifstream::ifstream((ostringstream *)local_290,*(char **)fileName_00,_S_in);
          if ((abStack_270[*(long *)(local_290._0_8_ + -0x18)] & 5) == 0) {
            local_550._0_8_ = local_550 + 0x10;
            local_550._8_8_ = 0;
            local_550[0x10] = 0;
            pcVar1 = (char *)0xffffffffffffffff;
LAB_00179d1c:
            pcVar14 = pcVar1;
            this_01 = (cmCTestCoverageHandler *)local_550;
            bVar8 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_290,(string *)local_550,(bool *)0x0,-1);
            if (bVar8) {
              pcVar1 = pcVar14 + 1;
              if (0xb < (ulong)local_550._8_8_) {
                local_410 = pcVar14;
                std::__cxx11::string::substr((ulong)&local_508,(ulong)local_550);
                if ((local_508->field_0x5 != ' ') && (local_508->field_0x5 != ':')) {
                  std::__cxx11::string::substr((ulong)local_408,(ulong)local_550);
                  std::__cxx11::string::operator=((string *)&local_508,(string *)local_408);
                  if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
                    operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                                    (ulong)((long)&local_3f8[0]->_M_color + 1));
                  }
                  if ((local_508->field_0x6 != ' ') && (local_508->field_0x6 != ':')) {
                    std::__cxx11::string::substr((ulong)local_408,(ulong)local_550);
                    std::__cxx11::string::operator=((string *)&local_508,(string *)local_408);
                    if ((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_) != local_3f8) {
                      operator_delete((_Base_ptr *)CONCAT44(local_408._4_4_,local_408._0_4_),
                                      (ulong)((long)&local_3f8[0]->_M_color + 1));
                    }
                    if ((local_508->field_0x7 != ' ') && (local_508->field_0x7 != ':')) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_408,
                                 "Currently the limit is maximum coverage of 999999",0x31);
                      cVar5 = (char)(ostringstream *)local_408;
                      std::ios::widen((char)*(undefined8 *)
                                             (CONCAT44(local_408._4_4_,local_408._0_4_) + -0x18) +
                                      cVar5);
                      std::ostream::put(cVar5);
                      std::ostream::flush();
                      pcVar3 = ((cmCTestGenericHandler *)local_550._32_8_)->CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar3,7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x6bb,(char *)local_550._40_8_,false);
                      if ((_Base_ptr *)local_550._40_8_ != local_518) {
                        operator_delete((void *)local_550._40_8_,
                                        (ulong)((long)&local_518[0]->_M_color + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
                      std::ios_base::~ios_base(local_398);
                    }
                  }
                }
                p_Var7 = local_508;
                iVar9 = atoi((char *)local_508);
                if (*(char *)((long)p_Var7 + (local_500 - 1)) != ':') {
                  iVar9 = 0;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_408,"Prefix: ",8);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_408,(char *)local_508,local_500);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," cov: ",6);
                plVar10 = (long *)std::ostream::operator<<(poVar11,iVar9);
                std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                std::ostream::put((char)plVar10);
                std::ostream::flush();
                uVar6 = local_550._32_8_;
                pcVar3 = ((cmCTestGenericHandler *)local_550._32_8_)->CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar3,0,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x6c8,(char *)local_550._40_8_,((cmCTestGenericHandler *)uVar6)->Quiet
                            );
                pcVar14 = local_410;
                if ((_Base_ptr *)local_550._40_8_ != local_518) {
                  operator_delete((void *)local_550._40_8_,
                                  (ulong)((long)&local_518[0]->_M_color + 1));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
                std::ios_base::~ios_base(local_398);
                do {
                  piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  __position._M_current =
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  while( true ) {
                    if (pcVar1 < (char *)((long)__position._M_current - (long)piVar4 >> 2)) {
                      iVar12 = piVar4[(long)(pcVar14 + 1)];
                      if ((iVar12 < 0) && (-1 < iVar9)) {
                        piVar4[(long)(pcVar14 + 1)] = 0;
                        iVar12 = 0;
                      }
                      piVar4[(long)(pcVar14 + 1)] = iVar12 + iVar9;
                      if (local_508 != (_Base_ptr)local_4f8) {
                        operator_delete(local_508,local_4f8._0_8_ + 1);
                      }
                      goto LAB_00179d1c;
                    }
                    local_408._0_4_ = ~_S_red;
                    if (__position._M_current ==
                        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage) break;
                    *__position._M_current = -1;
                    __position._M_current = __position._M_current + 1;
                    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current;
                  }
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (this_00,__position,(int *)local_408);
                } while( true );
              }
              goto LAB_00179d1c;
            }
            if ((undefined1 *)local_550._0_8_ != local_550 + 0x10) {
              this_01 = (cmCTestCoverageHandler *)(CONCAT71(local_550._17_7_,local_550[0x10]) + 1);
              operator_delete((void *)local_550._0_8_,(ulong)this_01);
            }
            iVar9 = (int)local_4b8._16_8_;
            this = (cmCTestCoverageHandler *)local_550._32_8_;
            cont = local_428;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_408,"Cannot open file: ",0x12);
            iVar9 = (int)local_4b8._16_8_;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_408,*(char **)fileName_00,
                                 (long)fileName_00->_M_parent);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar3 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x69f,(char *)local_550._0_8_,false);
            if ((undefined1 *)local_550._0_8_ != local_550 + 0x10) {
              operator_delete((void *)local_550._0_8_,CONCAT71(local_550._17_7_,local_550[0x10]) + 1
                             );
            }
            this_01 = (cmCTestCoverageHandler *)&std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
            std::ios_base::~ios_base(local_398);
          }
          std::ifstream::~ifstream((ostringstream *)local_290);
          if (local_490._16_8_ != (long)local_490 + 0x20U) {
            this_01 = (cmCTestCoverageHandler *)(local_490._32_8_ + 1);
            operator_delete((void *)local_490._16_8_,(ulong)this_01);
          }
          pbVar15 = (pointer)(ulong)(iVar9 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          this_01 = (cmCTestCoverageHandler *)(local_448.field_2._M_allocated_capacity + 1);
          operator_delete(local_448._M_dataplus._M_p,(ulong)this_01);
        }
        fileName_00 = fileName_00 + 1;
      } while (fileName_00 != local_418);
    }
    iVar9 = (int)pbVar15;
    if ((_Base_ptr)local_4e8._0_8_ != (_Base_ptr)(local_4e8 + 0x10)) {
      operator_delete((void *)local_4e8._0_8_,(ulong)((long)(_Rb_tree_color *)local_4d8._0_8_ + 1));
    }
    if ((pointer)local_4b8._24_8_ != (pointer)((long)local_4b8 + 0x28U)) {
      operator_delete((void *)local_4b8._24_8_,(ulong)(local_490._0_8_ + 1));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_460);
  if ((cmCTestCommand *)local_4c8._0_8_ != (cmCTestCommand *)(local_4c8 + 0x10)) {
    operator_delete((void *)local_4c8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_4b8._0_8_)->_M_p + 1));
  }
  cmsys::Glob::~Glob(&local_88);
  return iVar9;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string prefix = nl.substr(0, 6);
        if (prefix[5] != ' ' && prefix[5] != ':') {
          // This is a hack. We should really do something more elaborate
          prefix = nl.substr(0, 7);
          if (prefix[6] != ' ' && prefix[6] != ':') {
            prefix = nl.substr(0, 8);
            if (prefix[7] != ' ' && prefix[7] != ':') {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Currently the limit is maximum coverage of 999999"
                           << std::endl);
            }
          }
        }
        int cov = atoi(prefix.c_str());
        if (prefix[prefix.size() - 1] != ':') {
          // This line does not have ':' so no coverage here. That said,
          // Trace.py does not handle not covered lines versus comments etc.
          // So, this will be set to 0.
          cov = 0;
        }
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "Prefix: " << prefix << " cov: " << cov << std::endl, this->Quiet);
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}